

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo>::operator=
          (CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo> *this,
          CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo> *other)

{
  ChromeLatencyInfo *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeLatencyInfo,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (ChromeLatencyInfo *)operator_new(0x70);
  perfetto::protos::gen::ChromeLatencyInfo::ChromeLatencyInfo(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeLatencyInfo,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }